

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  char cVar1;
  u8 uVar2;
  u16 uVar3;
  uint uVar4;
  MemPage *pMVar5;
  int iVar6;
  long lVar7;
  ushort uVar8;
  ulong uVar9;
  
  uVar9 = (ulong)(uint)flags;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  if (pCur->eState == '\x01') {
    pMVar5 = pCur->apPage[pCur->iPage];
    uVar3 = pCur->ix;
    uVar8 = uVar3 + 1;
    pCur->ix = uVar8;
    if (pMVar5->nCell <= uVar8) {
      pCur->ix = uVar3;
      iVar6 = btreeNext(pCur);
      return iVar6;
    }
    if (pMVar5->leaf != '\0') {
      return 0;
    }
    pMVar5 = pCur->apPage[pCur->iPage];
    uVar2 = pMVar5->leaf;
    while( true ) {
      if (uVar2 != '\0') {
        return 0;
      }
      uVar4 = *(uint *)(pMVar5->aData +
                       (CONCAT11(pMVar5->aCellIdx[(ulong)pCur->ix * 2],
                                 pMVar5->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar5->maskPage));
      iVar6 = moveToChild(pCur,uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18);
      if (iVar6 != 0) break;
      pMVar5 = pCur->apPage[pCur->iPage];
      uVar2 = pMVar5->leaf;
    }
    return iVar6;
  }
  if (pCur->eState != 1) {
    iVar6 = 0;
    if (2 < pCur->eState) {
      iVar6 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar6 != 0) {
      return iVar6;
    }
    if (pCur->eState == '\0') {
      return 0x65;
    }
    iVar6 = pCur->skipNext;
    if (iVar6 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar6) {
        return 0;
      }
    }
  }
  pMVar5 = pCur->apPage[pCur->iPage];
  uVar8 = pCur->ix + 1;
  pCur->ix = uVar8;
  if (uVar8 < pMVar5->nCell) {
    if (pMVar5->leaf == '\0') {
LAB_00140e6f:
      iVar6 = moveToLeftmost(pCur);
      return iVar6;
    }
  }
  else {
    if (pMVar5->leaf == '\0') {
      uVar4 = *(uint *)(pMVar5->aData + (ulong)pMVar5->hdrOffset + 8);
      iVar6 = moveToChild(pCur,uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18);
      if (iVar6 != 0) {
        return iVar6;
      }
      goto LAB_00140e6f;
    }
    do {
      cVar1 = pCur->iPage;
      lVar7 = (long)cVar1;
      if (lVar7 == 0) {
        pCur->eState = '\0';
        return 0x65;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->ix = pCur->aiIdx[lVar7 + -1];
      pCur->iPage = cVar1 + -1;
      sqlite3PagerUnrefNotNull(pCur->apPage[lVar7]->pDbPage);
    } while (pCur->apPage[pCur->iPage]->nCell <= pCur->ix);
    if (pCur->apPage[pCur->iPage]->intKey != '\0') {
      iVar6 = sqlite3BtreeNext(pCur,(int)uVar9);
      return iVar6;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}